

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall
font2svg::glyph::typography_box_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  int iVar1;
  string *psVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  allocator<char> local_59;
  string *local_58;
  string local_50 [32];
  
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_59);
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  std::__cxx11::string::~string(local_50);
  std::operator<<((ostream *)&this->field_0x270,"\n\n  <!-- draw bearing + advance box --> ");
  iVar4 = (int)(this->gm).height + (int)(this->gm).vertBearingY;
  iVar1 = (int)(this->gm).horiAdvance;
  iVar5 = (int)(this->gm).vertAdvance - iVar4;
  iVar4 = -iVar4;
  poVar3 = std::operator<<((ostream *)&this->field_0x270,
                           "\n <path stroke=\'blue\' fill=\'none\' stroke-dasharray=\'10,16\' d=\'")
  ;
  poVar3 = std::operator<<(poVar3," M");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
  poVar3 = std::operator<<(poVar3," M");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  poVar3 = std::operator<<(poVar3," L");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  poVar3 = std::operator<<(poVar3," L");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
  poVar3 = std::operator<<(poVar3," L");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
  std::operator<<(poVar3," \'/>");
  psVar2 = local_58;
  std::__cxx11::stringbuf::str();
  return psVar2;
}

Assistant:

std::string typography_box()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw bearing + advance box --> ";
		int x1 = 0;
		int x2 = gm.horiAdvance;
		int y1 = -gm.vertBearingY-gm.height;
		int y2 = y1 + gm.vertAdvance;
		tmp << "\n <path stroke='blue' fill='none' stroke-dasharray='10,16' d='"
			<< " M" << x1 << "," << y1
			<< " M" << x1 << "," << y2
			<< " L" << x2 << "," << y2
			<< " L" << x2 << "," << y1
			<< " L" << x1 << "," << y1
			<< " '/>";

		return tmp.str();
	}